

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Option<Catch::TagAlias>::reset(Option<Catch::TagAlias> *this)

{
  Option<Catch::TagAlias> *this_local;
  
  if (this->nullableValue != (TagAlias *)0x0) {
    TagAlias::~TagAlias(this->nullableValue);
  }
  this->nullableValue = (TagAlias *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = NULL;
        }